

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

void Mop_ManReduce(Mop_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *vGroup2_00;
  abctime aVar7;
  Vec_Wec_t *vGroups;
  int nContain;
  int nEqual;
  int nOutLits2;
  int nOutLits;
  int k;
  int i;
  Vec_Int_t *vGroup2;
  Vec_Int_t *vGroup;
  abctime clk;
  Mop_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  vGroups._4_4_ = 0;
  vGroups._0_4_ = 0;
  p_00 = Mop_ManCreateGroups(p);
  uVar1 = Mop_ManCountOutputLits(p);
  for (nOutLits = 0; iVar2 = Vec_WecSize(p_00), nOutLits < iVar2; nOutLits = nOutLits + 1) {
    pVVar6 = Vec_WecEntry(p_00,nOutLits);
    iVar2 = Mop_ManRemoveIdentical(p,pVVar6);
    vGroups._4_4_ = iVar2 + vGroups._4_4_;
  }
  for (nOutLits = 0; iVar2 = Vec_WecSize(p_00), nOutLits < iVar2; nOutLits = nOutLits + 1) {
    pVVar6 = Vec_WecEntry(p_00,nOutLits);
    nOutLits2 = nOutLits;
    while( true ) {
      nOutLits2 = nOutLits2 + 1;
      iVar2 = Vec_WecSize(p_00);
      if (iVar2 <= nOutLits2) break;
      vGroup2_00 = Vec_WecEntry(p_00,nOutLits2);
      iVar2 = Mop_ManMergeContainTwo(p,pVVar6,vGroup2_00);
      vGroups._0_4_ = iVar2 + (uint)vGroups;
    }
  }
  uVar3 = Mop_ManCountOutputLits(p);
  Mop_ManUnCreateGroups(p,p_00);
  Vec_WecFree(p_00);
  uVar4 = Vec_IntSize(p->vCubes);
  printf("Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ",
         (ulong)uVar4,(ulong)vGroups._4_4_,(ulong)(uint)vGroups,(ulong)uVar1,(ulong)uVar3);
  aVar7 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar7 - aVar5);
  return;
}

Assistant:

void Mop_ManReduce( Mop_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, nOutLits, nOutLits2, nEqual = 0, nContain = 0;
    Vec_Wec_t * vGroups = Mop_ManCreateGroups( p );
    // initial stats
    nOutLits = Mop_ManCountOutputLits( p );
    // check identical cubes within each group
    Vec_WecForEachLevel( vGroups, vGroup, i )
        nEqual += Mop_ManRemoveIdentical( p, vGroup );
    // check contained cubes
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            nContain += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    // final stats
    nOutLits2 = Mop_ManCountOutputLits( p );
    Mop_ManUnCreateGroups( p, vGroups );
    Vec_WecFree( vGroups );
    // report
    printf( "Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ", Vec_IntSize(p->vCubes), nEqual, nContain, nOutLits, nOutLits2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}